

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balance.hpp
# Opt level: O0

void summary_stats(Master *master)

{
  value_type vVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Master *master_00;
  reference pvVar5;
  communicator *this;
  Master *in_RDI;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_work;
  vector<WorkInfo,_std::allocator<WorkInfo>_> all_work_info;
  int in_stack_ffffffffffffff7c;
  Master *in_stack_ffffffffffffff80;
  allocator_type *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint local_4c;
  vector<WorkInfo,_std::allocator<WorkInfo>_> *in_stack_ffffffffffffffc0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc8;
  Master *in_stack_ffffffffffffffd0;
  
  Catch::clara::std::vector<WorkInfo,_std::allocator<WorkInfo>_>::vector
            ((vector<WorkInfo,_std::allocator<WorkInfo>_> *)0x1212e9);
  uVar2 = diy::Master::size((Master *)0x1212f6);
  master_00 = (Master *)(ulong)uVar2;
  Catch::clara::std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x121316);
  Catch::clara::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)master_00,
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),in_stack_ffffffffffffff90
            );
  Catch::clara::std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x121336);
  local_4c = 0;
  while( true ) {
    uVar2 = local_4c;
    uVar3 = diy::Master::size((Master *)0x121353);
    if (uVar3 <= uVar2) break;
    in_stack_ffffffffffffff90 =
         (allocator_type *)diy::Master::block(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    vVar1 = *(value_type *)(in_stack_ffffffffffffff90 + 0xa0);
    pvVar5 = Catch::clara::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xffffffffffffffc8,(long)(int)local_4c);
    *pvVar5 = vVar1;
    local_4c = local_4c + 1;
  }
  gather_work_info(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  this = diy::Master::communicator(in_RDI);
  iVar4 = diy::mpi::communicator::rank(this);
  if (iVar4 == 0) {
    stats_work_info(master_00,(vector<WorkInfo,_std::allocator<WorkInfo>_> *)CONCAT44(uVar3,uVar2));
  }
  Catch::clara::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff90);
  Catch::clara::std::vector<WorkInfo,_std::allocator<WorkInfo>_>::~vector
            ((vector<WorkInfo,_std::allocator<WorkInfo>_> *)in_stack_ffffffffffffff90);
  return;
}

Assistant:

void summary_stats(const diy::Master& master)
{
    std::vector<WorkInfo>  all_work_info;
    std::vector<diy::Work>      local_work(master.size());

    for (auto i = 0; i < master.size(); i++)
        local_work[i] = static_cast<Block*>(master.block(i))->work;

    gather_work_info(master, local_work, all_work_info);
    if (master.communicator().rank() == 0)
        stats_work_info(master, all_work_info);
}